

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lemon.c
# Opt level: O0

int statecmp(config *a,config *b)

{
  bool bVar1;
  int local_1c;
  config *pcStack_18;
  int rc;
  config *b_local;
  config *a_local;
  
  local_1c = 0;
  pcStack_18 = b;
  b_local = a;
  while( true ) {
    bVar1 = false;
    if ((local_1c == 0) && (bVar1 = false, b_local != (config *)0x0)) {
      bVar1 = pcStack_18 != (config *)0x0;
    }
    if (!bVar1) break;
    local_1c = b_local->rp->index - pcStack_18->rp->index;
    if (local_1c == 0) {
      local_1c = b_local->dot - pcStack_18->dot;
    }
    b_local = b_local->bp;
    pcStack_18 = pcStack_18->bp;
  }
  if (local_1c == 0) {
    if (b_local != (config *)0x0) {
      local_1c = 1;
    }
    if (pcStack_18 != (config *)0x0) {
      local_1c = -1;
    }
  }
  return local_1c;
}

Assistant:

PRIVATE int statecmp(struct config *a, struct config *b)
{
  int rc;
  for(rc=0; rc==0 && a && b;  a=a->bp, b=b->bp){
    rc = a->rp->index - b->rp->index;
    if( rc==0 ) rc = a->dot - b->dot;
  }
  if( rc==0 ){
    if( a ) rc = 1;
    if( b ) rc = -1;
  }
  return rc;
}